

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArmaturePopulate.cpp
# Opt level: O0

bool Assimp::ArmaturePopulate::IsBoneNode
               (aiString *bone_name,vector<aiBone_*,_std::allocator<aiBone_*>_> *bones)

{
  bool bVar1;
  reference ppaVar2;
  aiBone *bone;
  iterator __end1;
  iterator __begin1;
  vector<aiBone_*,_std::allocator<aiBone_*>_> *__range1;
  vector<aiBone_*,_std::allocator<aiBone_*>_> *bones_local;
  aiString *bone_name_local;
  
  __end1 = std::vector<aiBone_*,_std::allocator<aiBone_*>_>::begin(bones);
  bone = (aiBone *)std::vector<aiBone_*,_std::allocator<aiBone_*>_>::end(bones);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<aiBone_**,_std::vector<aiBone_*,_std::allocator<aiBone_*>_>_>
                                *)&bone);
    if (!bVar1) {
      return false;
    }
    ppaVar2 = __gnu_cxx::
              __normal_iterator<aiBone_**,_std::vector<aiBone_*,_std::allocator<aiBone_*>_>_>::
              operator*(&__end1);
    bVar1 = aiString::operator==(&(*ppaVar2)->mName,bone_name);
    if (bVar1) break;
    __gnu_cxx::__normal_iterator<aiBone_**,_std::vector<aiBone_*,_std::allocator<aiBone_*>_>_>::
    operator++(&__end1);
  }
  return true;
}

Assistant:

bool ArmaturePopulate::IsBoneNode(const aiString &bone_name,
                                  std::vector<aiBone *> &bones) {
  for (aiBone *bone : bones) {
    if (bone->mName == bone_name) {
      return true;
    }
  }

  return false;
}